

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::setLayoutQualifier
          (HlslParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TString *id)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  iterator __first;
  iterator __last;
  iterator __result;
  char *pcVar4;
  TBlendEquationShift local_54;
  TBlendEquationShift be;
  bool found;
  TLayoutDepth depth;
  TString *id_local;
  TQualifier *qualifier_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  __first = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::begin(id);
  __last = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::end(id);
  __result = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::begin(id);
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,int(*)(int)noexcept>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
              )__first._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
              )__last._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
              )__result._M_current,tolower);
  pcVar4 = TQualifier::getLayoutMatrixString(ElmColumnMajor);
  bVar1 = std::operator==(id,pcVar4);
  if (bVar1) {
    *(ulong *)&qualifier->field_0x8 =
         *(ulong *)&qualifier->field_0x8 & 0x1fffffffffffffff | 0x2000000000000000;
  }
  else {
    pcVar4 = TQualifier::getLayoutMatrixString(ElmRowMajor);
    bVar1 = std::operator==(id,pcVar4);
    if (bVar1) {
      *(ulong *)&qualifier->field_0x8 =
           *(ulong *)&qualifier->field_0x8 & 0x1fffffffffffffff | 0x4000000000000000;
    }
    else {
      bVar1 = std::operator==(id,"push_constant");
      if (bVar1) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2a])
                  (this,loc,"push_constant");
        qualifier->layoutPushConstant = true;
      }
      else {
        if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry) ||
           ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessEvaluation))
        {
          pcVar4 = TQualifier::getGeometryString(ElgTriangles);
          bVar1 = std::operator==(id,pcVar4);
          if (bVar1) {
            pcVar4 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     c_str(id);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                      (this,loc,"ignored",pcVar4,"");
            return;
          }
          if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry) {
            pcVar4 = TQualifier::getGeometryString(ElgPoints);
            bVar1 = std::operator==(id,pcVar4);
            if (bVar1) {
              pcVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(id);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"ignored",pcVar4,"");
              return;
            }
            pcVar4 = TQualifier::getGeometryString(ElgLineStrip);
            bVar1 = std::operator==(id,pcVar4);
            if (bVar1) {
              pcVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(id);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"ignored",pcVar4,"");
              return;
            }
            pcVar4 = TQualifier::getGeometryString(ElgLines);
            bVar1 = std::operator==(id,pcVar4);
            if (bVar1) {
              pcVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(id);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"ignored",pcVar4,"");
              return;
            }
            pcVar4 = TQualifier::getGeometryString(ElgLinesAdjacency);
            bVar1 = std::operator==(id,pcVar4);
            if (bVar1) {
              pcVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(id);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"ignored",pcVar4,"");
              return;
            }
            pcVar4 = TQualifier::getGeometryString(ElgTrianglesAdjacency);
            bVar1 = std::operator==(id,pcVar4);
            if (bVar1) {
              pcVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(id);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"ignored",pcVar4,"");
              return;
            }
            pcVar4 = TQualifier::getGeometryString(ElgTriangleStrip);
            bVar1 = std::operator==(id,pcVar4);
            if (bVar1) {
              pcVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(id);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"ignored",pcVar4,"");
              return;
            }
          }
          else {
            if ((this->super_TParseContextBase).super_TParseVersions.language !=
                EShLangTessEvaluation) {
              __assert_fail("language == EShLangTessEvaluation",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                            ,0x1bfb,
                            "void glslang::HlslParseContext::setLayoutQualifier(const TSourceLoc &, TQualifier &, TString &)"
                           );
            }
            pcVar4 = TQualifier::getGeometryString(ElgTriangles);
            bVar1 = std::operator==(id,pcVar4);
            if (bVar1) {
              pcVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(id);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"ignored",pcVar4,"");
              return;
            }
            pcVar4 = TQualifier::getGeometryString(ElgQuads);
            bVar1 = std::operator==(id,pcVar4);
            if (bVar1) {
              pcVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(id);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"ignored",pcVar4,"");
              return;
            }
            pcVar4 = TQualifier::getGeometryString(ElgIsolines);
            bVar1 = std::operator==(id,pcVar4);
            if (bVar1) {
              pcVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(id);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"ignored",pcVar4,"");
              return;
            }
            pcVar4 = TQualifier::getVertexSpacingString(EvsEqual);
            bVar1 = std::operator==(id,pcVar4);
            if (bVar1) {
              pcVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(id);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"ignored",pcVar4,"");
              return;
            }
            pcVar4 = TQualifier::getVertexSpacingString(EvsFractionalEven);
            bVar1 = std::operator==(id,pcVar4);
            if (bVar1) {
              pcVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(id);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"ignored",pcVar4,"");
              return;
            }
            pcVar4 = TQualifier::getVertexSpacingString(EvsFractionalOdd);
            bVar1 = std::operator==(id,pcVar4);
            if (bVar1) {
              pcVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(id);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"ignored",pcVar4,"");
              return;
            }
            pcVar4 = TQualifier::getVertexOrderString(EvoCw);
            bVar1 = std::operator==(id,pcVar4);
            if (bVar1) {
              pcVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(id);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"ignored",pcVar4,"");
              return;
            }
            pcVar4 = TQualifier::getVertexOrderString(EvoCcw);
            bVar1 = std::operator==(id,pcVar4);
            if (bVar1) {
              pcVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(id);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"ignored",pcVar4,"");
              return;
            }
            bVar1 = std::operator==(id,"point_mode");
            if (bVar1) {
              pcVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(id);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"ignored",pcVar4,"");
              return;
            }
          }
        }
        if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) {
          bVar1 = std::operator==(id,"origin_upper_left");
          if (bVar1) {
            pcVar4 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     c_str(id);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                      (this,loc,"ignored",pcVar4,"");
            return;
          }
          bVar1 = std::operator==(id,"pixel_center_integer");
          if (bVar1) {
            pcVar4 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     c_str(id);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                      (this,loc,"ignored",pcVar4,"");
            return;
          }
          bVar1 = std::operator==(id,"early_fragment_tests");
          if (bVar1) {
            pcVar4 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     c_str(id);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                      (this,loc,"ignored",pcVar4,"");
            return;
          }
          for (be = EBlendScreen; (int)be < 5; be = be + EBlendScreen) {
            pcVar4 = TQualifier::getLayoutDepthString(be);
            bVar1 = std::operator==(id,pcVar4);
            if (bVar1) {
              pcVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(id);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"ignored",pcVar4,"");
              return;
            }
          }
          iVar3 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(id,0,0xd,"blend_support");
          if (iVar3 == 0) {
            bVar1 = false;
            local_54 = EBlendMultiply;
            do {
              if (0xf < (int)local_54) {
LAB_005788e5:
                if (bVar1) {
                  return;
                }
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,loc,"unknown blend equation","blend_support","");
                return;
              }
              pcVar4 = TQualifier::getBlendEquationString(local_54);
              bVar2 = std::operator==(id,pcVar4);
              if (bVar2) {
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                          (this,loc,1,&E_GL_KHR_blend_equation_advanced,"blend equation");
                TIntermediate::addBlendEquation
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           local_54);
                pcVar4 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         ::c_str(id);
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                          (this,loc,"ignored",pcVar4,"");
                bVar1 = true;
                goto LAB_005788e5;
              }
              local_54 = local_54 + EBlendScreen;
            } while( true );
          }
        }
        pcVar4 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (id);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,
                   "unrecognized layout identifier, or qualifier requires assignment (e.g., binding = 4)"
                   ,pcVar4,"");
      }
    }
  }
  return;
}

Assistant:

void HlslParseContext::setLayoutQualifier(const TSourceLoc& loc, TQualifier& qualifier, TString& id)
{
    std::transform(id.begin(), id.end(), id.begin(), ::tolower);

    if (id == TQualifier::getLayoutMatrixString(ElmColumnMajor)) {
        qualifier.layoutMatrix = ElmRowMajor;
        return;
    }
    if (id == TQualifier::getLayoutMatrixString(ElmRowMajor)) {
        qualifier.layoutMatrix = ElmColumnMajor;
        return;
    }
    if (id == "push_constant") {
        requireVulkan(loc, "push_constant");
        qualifier.layoutPushConstant = true;
        return;
    }
    if (language == EShLangGeometry || language == EShLangTessEvaluation) {
        if (id == TQualifier::getGeometryString(ElgTriangles)) {
            // publicType.shaderQualifiers.geometry = ElgTriangles;
            warn(loc, "ignored", id.c_str(), "");
            return;
        }
        if (language == EShLangGeometry) {
            if (id == TQualifier::getGeometryString(ElgPoints)) {
                // publicType.shaderQualifiers.geometry = ElgPoints;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgLineStrip)) {
                // publicType.shaderQualifiers.geometry = ElgLineStrip;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgLines)) {
                // publicType.shaderQualifiers.geometry = ElgLines;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgLinesAdjacency)) {
                // publicType.shaderQualifiers.geometry = ElgLinesAdjacency;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgTrianglesAdjacency)) {
                // publicType.shaderQualifiers.geometry = ElgTrianglesAdjacency;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgTriangleStrip)) {
                // publicType.shaderQualifiers.geometry = ElgTriangleStrip;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
        } else {
            assert(language == EShLangTessEvaluation);

            // input primitive
            if (id == TQualifier::getGeometryString(ElgTriangles)) {
                // publicType.shaderQualifiers.geometry = ElgTriangles;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgQuads)) {
                // publicType.shaderQualifiers.geometry = ElgQuads;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgIsolines)) {
                // publicType.shaderQualifiers.geometry = ElgIsolines;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }

            // vertex spacing
            if (id == TQualifier::getVertexSpacingString(EvsEqual)) {
                // publicType.shaderQualifiers.spacing = EvsEqual;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getVertexSpacingString(EvsFractionalEven)) {
                // publicType.shaderQualifiers.spacing = EvsFractionalEven;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getVertexSpacingString(EvsFractionalOdd)) {
                // publicType.shaderQualifiers.spacing = EvsFractionalOdd;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }

            // triangle order
            if (id == TQualifier::getVertexOrderString(EvoCw)) {
                // publicType.shaderQualifiers.order = EvoCw;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getVertexOrderString(EvoCcw)) {
                // publicType.shaderQualifiers.order = EvoCcw;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }

            // point mode
            if (id == "point_mode") {
                // publicType.shaderQualifiers.pointMode = true;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
        }
    }
    if (language == EShLangFragment) {
        if (id == "origin_upper_left") {
            // publicType.shaderQualifiers.originUpperLeft = true;
            warn(loc, "ignored", id.c_str(), "");
            return;
        }
        if (id == "pixel_center_integer") {
            // publicType.shaderQualifiers.pixelCenterInteger = true;
            warn(loc, "ignored", id.c_str(), "");
            return;
        }
        if (id == "early_fragment_tests") {
            // publicType.shaderQualifiers.earlyFragmentTests = true;
            warn(loc, "ignored", id.c_str(), "");
            return;
        }
        for (TLayoutDepth depth = (TLayoutDepth)(EldNone + 1); depth < EldCount; depth = (TLayoutDepth)(depth + 1)) {
            if (id == TQualifier::getLayoutDepthString(depth)) {
                // publicType.shaderQualifiers.layoutDepth = depth;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
        }
        if (id.compare(0, 13, "blend_support") == 0) {
            bool found = false;
            for (TBlendEquationShift be = (TBlendEquationShift)0; be < EBlendCount; be = (TBlendEquationShift)(be + 1)) {
                if (id == TQualifier::getBlendEquationString(be)) {
                    requireExtensions(loc, 1, &E_GL_KHR_blend_equation_advanced, "blend equation");
                    intermediate.addBlendEquation(be);
                    // publicType.shaderQualifiers.blendEquation = true;
                    warn(loc, "ignored", id.c_str(), "");
                    found = true;
                    break;
                }
            }
            if (! found)
                error(loc, "unknown blend equation", "blend_support", "");
            return;
        }
    }
    error(loc, "unrecognized layout identifier, or qualifier requires assignment (e.g., binding = 4)", id.c_str(), "");
}